

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

bool __thiscall banksia::ChessBoard::isValid(ChessBoard *this)

{
  bool bVar1;
  int iVar2;
  Side side;
  long *in_RDI;
  bool b;
  int pawnPos;
  int row;
  Piece piece;
  int i;
  int pieceCout [2] [7];
  BoardCore *in_stack_ffffffffffffff88;
  bool local_6d;
  Side in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Piece local_54;
  int local_4c;
  int local_48 [4];
  int local_38;
  int local_34;
  int local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  memset(local_48,0,0x38);
  for (local_4c = 0; local_4c < 0x40; local_4c = local_4c + 1) {
    local_54 = BoardCore::getPiece(in_stack_ffffffffffffff88,0);
    bVar1 = Piece::isEmpty(&local_54);
    if (!bVar1) {
      local_48[(long)(int)local_54.side * 7 + (long)(int)local_54.type] =
           local_48[(long)(int)local_54.side * 7 + (long)(int)local_54.type] + 1;
      if ((local_54.type == pawn) && ((local_4c < 8 || (0x37 < local_4c)))) {
        return false;
      }
    }
  }
  if ((int)*(char *)((long)in_RDI + 0xb4) + (int)*(char *)((long)in_RDI + 0xb5) != 0) {
    if (*(char *)((long)in_RDI + 0xb4) != '\0') {
      bVar1 = BoardCore::isPiece((BoardCore *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                 in_stack_ffffffffffffff94);
      if (!bVar1) {
        return false;
      }
      if (((((int)*(char *)((long)in_RDI + 0xb4) & *(uint *)(in_RDI + 0x14)) != 0) &&
          (bVar1 = BoardCore::isPiece((BoardCore *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                      (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                      in_stack_ffffffffffffff94), !bVar1)) ||
         ((((int)*(char *)((long)in_RDI + 0xb4) & *(uint *)((long)in_RDI + 0xa4)) != 0 &&
          (bVar1 = BoardCore::isPiece((BoardCore *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                      (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                      in_stack_ffffffffffffff94), !bVar1)))) {
        return false;
      }
    }
    if (*(char *)((long)in_RDI + 0xb5) != '\0') {
      bVar1 = BoardCore::isPiece((BoardCore *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                 in_stack_ffffffffffffff94);
      if (!bVar1) {
        return false;
      }
      if (((((int)*(char *)((long)in_RDI + 0xb5) & *(uint *)(in_RDI + 0x14)) != 0) &&
          (bVar1 = BoardCore::isPiece((BoardCore *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                      (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                      in_stack_ffffffffffffff94), !bVar1)) ||
         ((((int)*(char *)((long)in_RDI + 0xb5) & *(uint *)((long)in_RDI + 0xa4)) != 0 &&
          (bVar1 = BoardCore::isPiece((BoardCore *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                      (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,
                                      in_stack_ffffffffffffff94), !bVar1)))) {
        return false;
      }
    }
  }
  if (0 < (int)in_RDI[0x16]) {
    iVar2 = (**(code **)(*in_RDI + 0x48))(in_RDI,(int)in_RDI[0x16]);
    if ((iVar2 != 2) && (iVar2 != 5)) {
      return false;
    }
    if (iVar2 == 2) {
      side = (int)in_RDI[0x16] + 8;
    }
    else {
      side = (int)in_RDI[0x16] - 8;
    }
    bVar1 = BoardCore::isPiece((BoardCore *)CONCAT44(side,in_stack_ffffffffffffffa0),
                               (int)((ulong)in_RDI >> 0x20),(PieceType)in_RDI,side);
    if (!bVar1) {
      return false;
    }
  }
  local_6d = false;
  if (((((local_48[1] == 1) && (local_6d = false, local_28 == 1)) &&
       (local_6d = false, local_48[2] < 10)) &&
      ((((local_6d = false, local_24 < 10 && (local_6d = false, local_48[3] < 0xb)) &&
        ((local_6d = false, local_20 < 0xb &&
         ((local_6d = false, local_38 < 0xb && (local_6d = false, local_1c < 0xb)))))) &&
       (local_6d = false, local_34 < 0xb)))) &&
     ((((local_6d = false, local_18 < 0xb && (local_6d = false, local_30 < 9)) &&
       (local_6d = false, local_14 < 9)) &&
      (local_6d = false, local_48[2] + local_48[3] + local_38 + local_34 + local_30 < 0x10)))) {
    local_6d = local_24 + local_20 + local_1c + local_18 + local_14 < 0x10;
  }
  return local_6d;
}

Assistant:

bool ChessBoard::isValid() const {
    int pieceCout[2][7] = { { 0, 0, 0, 0, 0, 0, 0}, { 0, 0, 0, 0, 0, 0, 0} };
    
    for (int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            continue;
        }
        
        pieceCout[static_cast<int>(piece.side)][static_cast<int>(piece.type)] += 1;
        if (piece.type == PieceType::pawn) {
            if (i < 8 || i >= 56) {
                return false;
            }
        }
    }
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B]) {
            if (!isPiece(4, PieceType::king, Side::black)) {
                return false;
            }
            if (((castleRights[B] & CastleRight_long) && !isPiece(0, PieceType::rook, Side::black)) ||
                ((castleRights[B] & CastleRight_short) && !isPiece(7, PieceType::rook, Side::black))) {
                return false;
            }
        }
        
        if (castleRights[W]) {
            if (!isPiece(60, PieceType::king, Side::white)) {
                return false;
            }
            if (((castleRights[W] & CastleRight_long) && !isPiece(56, PieceType::rook, Side::white)) ||
                ((castleRights[W] & CastleRight_short) && !isPiece(63, PieceType::rook, Side::white))) {
                return false;
            }
        }
    }
    
    if (enpassant > 0) {
        auto row = getRow(enpassant);
        if (row != 2 && row != 5) {
            return false;
        }
        auto pawnPos = row == 2 ? (enpassant + 8) : (enpassant - 8);
        if (!isPiece(pawnPos, PieceType::pawn, row == 2 ? Side::black : Side::white)) {
            return false;
        }
    }
    
    bool b =
    pieceCout[0][1] == 1 && pieceCout[1][1] == 1 &&     // king
    pieceCout[0][2] <= 9 && pieceCout[1][2] <= 9 &&     // queen
    pieceCout[0][3] <= 10 && pieceCout[1][3] <= 10 &&     // rook
    pieceCout[0][4] <= 10 && pieceCout[1][4] <= 10 &&     // bishop
    pieceCout[0][5] <= 10 && pieceCout[1][5] <= 10 &&     // knight
    pieceCout[0][6] <= 8 && pieceCout[1][6] <= 8 &&       // pawn
    pieceCout[0][2]+pieceCout[0][3]+pieceCout[0][4]+pieceCout[0][5] + pieceCout[0][6] <= 15 &&
    pieceCout[1][2]+pieceCout[1][3]+pieceCout[1][4]+pieceCout[1][5] + pieceCout[1][6] <= 15;
    
    assert(b);
    return b;
}